

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseNodesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  bool bVar1;
  int iVar2;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  while ((iVar2 = ASSIMP_strincmp((char *)szCurrentOut_local,"end",3), iVar2 != 0 ||
         (bVar1 = IsSpaceOrNewLine<char>(*(char *)((long)szCurrentOut_local + 3)), !bVar1))) {
    ParseNodeInfo(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  }
  szCurrentOut_local = (char **)((long)szCurrentOut_local + 4);
  SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  *szCurrentOut = (char *)szCurrentOut_local;
  return;
}

Assistant:

void SMDImporter::ParseNodesSection(const char* szCurrent, const char** szCurrentOut) {
    for ( ;; ) {
        // "end\n" - Ends the nodes section
        if (0 == ASSIMP_strincmp(szCurrent,"end",3) && IsSpaceOrNewLine(*(szCurrent+3))) {
            szCurrent += 4;
            break;
        }
        ParseNodeInfo(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}